

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol(DescriptorPool *this,string *symbol_name)

{
  scoped_ptr<google::protobuf::DescriptorPool::Tables> *this_00;
  bool bVar1;
  Tables *pTVar2;
  FileDescriptor *pFVar3;
  Symbol SVar4;
  MutexLockMaybe lock;
  MutexLockMaybe MStack_38;
  Symbol local_30;
  
  internal::MutexLockMaybe::MutexLockMaybe(&MStack_38,this->mutex_);
  this_00 = &this->tables_;
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&pTVar2->known_bad_symbols_);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&pTVar2->known_bad_files_);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
  SVar4 = Tables::FindSymbol(pTVar2,symbol_name);
  local_30.field_1 = SVar4.field_1;
  local_30.type = SVar4.type;
  if (local_30.type == NULL_SYMBOL) {
    if (this->underlay_ != (DescriptorPool *)0x0) {
      pFVar3 = FindFileContainingSymbol(this->underlay_,symbol_name);
      if (pFVar3 != (FileDescriptor *)0x0) goto LAB_002dd149;
    }
    bVar1 = TryFindSymbolInFallbackDatabase(this,symbol_name);
    if (bVar1) {
      pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
      SVar4 = Tables::FindSymbol(pTVar2,symbol_name);
      local_30.field_1 = SVar4.field_1;
      local_30.type = SVar4.type;
      if (local_30.type != NULL_SYMBOL) goto LAB_002dd13c;
    }
    pFVar3 = (FileDescriptor *)0x0;
  }
  else {
LAB_002dd13c:
    pFVar3 = Symbol::GetFile(&local_30);
  }
LAB_002dd149:
  internal::MutexLockMaybe::~MutexLockMaybe(&MStack_38);
  return pFVar3;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    const string& symbol_name) const {
  MutexLockMaybe lock(mutex_);
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != NULL) {
    const FileDescriptor* file_result =
      underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != NULL) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return NULL;
}